

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end.c
# Opt level: O2

void done(int how)

{
  boolean bVar1;
  char cVar2;
  char cVar3;
  byte bVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  short sVar8;
  int iVar9;
  boolean show_empty;
  boolean show_empty_00;
  long lVar10;
  char *pcVar11;
  int iVar12;
  ulong uVar13;
  char *pcVar14;
  bool bVar15;
  bool bVar16;
  obj *local_1d8;
  boolean local_1c4;
  char local_1b8 [128];
  char pbuf [256];
  
  pcVar11 = killer;
  if (how == 0x11) {
LAB_0019063e:
    killer_format = 2;
LAB_0019064b:
    if (pcVar11 == (char *)0x0) {
      if ((how == 5) || (how == 3)) {
        killer_format = 1;
      }
      goto LAB_00190678;
    }
    if (((uint)how < 0x10) && ((0xb000U >> (how & 0x1fU) & 1) != 0)) goto LAB_00190678;
  }
  else {
    if (how != 0xd) {
      if (how == 10 && killer == (char *)0x0) {
        pcVar11 = (char *)0x0;
        goto LAB_0019063e;
      }
      goto LAB_0019064b;
    }
    if (killer != (char *)0x0) {
      paniclog("trickery",killer);
      killer = (char *)0x0;
    }
    if (flags.debug != '\0') {
      pline("You are a very tricky wizard, it seems.");
      return;
    }
LAB_00190678:
    pcVar11 = deaths_rel + *(int *)(deaths_rel + (long)how * 4);
  }
  strcpy(killbuf,pcVar11);
  killer = killbuf;
  if ((how < 0xc) && (u.umortality = u.umortality + 1, u.uprops[0x2b].extrinsic != 0)) {
    pline("But wait...");
    discover_object(0xca,'\x01','\x01');
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001906f4;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001906ef;
      pcVar11 = "begins to glow";
    }
    else {
LAB_001906ef:
      if (ublindf == (obj *)0x0) {
        pcVar11 = "feels warm";
      }
      else {
LAB_001906f4:
        pcVar11 = "feels warm";
        if (ublindf->oartifact == '\x1d') {
          pcVar11 = "begins to glow";
        }
      }
    }
    pline("Your medallion %s!",pcVar11);
    if (((uamul == (obj *)0x0) || ((uamul->field_0x4a & 1) == 0)) ||
       (uVar5 = mt_random(), (uVar5 & 3) != 0)) {
      if (how == 0xb) {
        pcVar11 = "You reconstitute!";
      }
      else {
        if (how == 1) {
          pline("You vomit ...");
        }
        pcVar11 = "You feel much better!";
      }
      pline(pcVar11);
      pline("The medallion crumbles to dust!");
      if (uamul != (obj *)0x0) {
        useup(uamul);
      }
      adjattrib(4,-1,'\0',1);
      if (u.uhpmax < 1) {
        u.uhpmax = 10;
      }
      savelife(how);
      if ((how != 10) || (bVar1 = is_playermon_genocided(), bVar1 == '\0')) {
        pcVar11 = "were saved from death by your amulet of life saving!";
        goto LAB_001908f9;
      }
      pline("Unfortunately you are still genocided...");
    }
    else {
      pcVar11 = surface((int)u.ux,(int)u.uy);
      pline("But... the chain on your medallion breaks and it falls to the %s!",pcVar11);
      You_hear("homeric laughter!");
      useup(uamul);
    }
  }
  if (((how < 0xc) && (flags.explore != '\0' || flags.debug != '\0')) &&
     (cVar2 = yn_function("Die?","yn",'n'), cVar2 != 'y')) {
    pcVar11 = "die";
    if (how == 0xb) {
      pcVar11 = "disintegrate";
    }
    pcVar14 = "choke";
    if (how != 1) {
      pcVar14 = pcVar11;
    }
    pline("OK, so you don\'t %s.",pcVar14);
    if (u.uhpmax < 1) {
      u.uhpmax = u.ulevel << 3;
    }
    savelife(how);
    pcVar11 = "were saved from death by your wizard powers!";
LAB_001908f9:
    killer = (char *)0x0;
    killer_format = 0;
    historic_event('\0',pcVar11);
    return;
  }
  if ((program_state.viewing != 0) || (program_state.gameover = 1, how == 0xc)) goto LAB_00190f9a;
  log_command_result();
  iflags.vision_inited = '\0';
  inven_inuse('\x01');
  if ((how < 0xc) && (moves < 2)) {
    pcVar11 = currency(200);
    pline("Do not pass go.  Do not collect 200 %s.",pcVar11);
  }
  if (how < 10) {
    bVar1 = can_make_bones(&u.uz);
    bVar15 = bVar1 != '\0';
    if (how == 9) {
      u.ugrave_arise = 0xd7;
      how = 9;
    }
    else if (u.ugrave_arise < 0 && bVar1 != '\0') {
      if (how == 8) {
        u.ugrave_arise = -2;
        bVar15 = true;
        how = 8;
      }
      else if (how == 5) {
        u.ugrave_arise = -3;
        bVar15 = true;
        how = 5;
      }
      else {
        bVar15 = true;
        if ((u.ugrave_arise == -1) &&
           (lVar6 = (long)u.umonnum, (mvitals[lVar6].mvflags & 0x10) == 0)) {
          if (u.umonnum == u.umonster) {
            sVar8 = urace.femalenum;
            if (urace.femalenum == -1) {
              sVar8 = urace.malenum;
            }
            if (flags.female == '\0') {
              sVar8 = urace.malenum;
            }
            lVar6 = (long)sVar8;
          }
          local_1d8 = mk_named_object(0x10e,mons + lVar6,(int)u.ux,(int)u.uy,plname);
          pcVar11 = killer;
          if (killer_format == 2) {
            pcVar14 = "";
          }
          else {
            pcVar14 = killed_by_prefix[how];
            if (killer_format == 0) {
              pcVar11 = an(killer);
            }
          }
          bVar16 = false;
          sprintf(pbuf,"%s, %s%s",plname,pcVar14,pcVar11);
          make_grave(level,(int)u.ux,(int)u.uy,pbuf);
          goto LAB_00190b4f;
        }
      }
    }
    bVar16 = false;
LAB_00190b47:
    local_1d8 = (obj *)0x0;
  }
  else {
    if (how != 0xe) {
      bVar16 = how == 0xf;
      if (how - 0xfU < 2) {
        killer_format = 2;
      }
      bVar15 = false;
      goto LAB_00190b47;
    }
    killer_format = 2;
    local_1d8 = (obj *)0x0;
    if (u.uhp < 1) {
      u.umortality = u.umortality + 1;
      builtin_strncpy(killbuf,"quit while already on Charon\'s boat",0x24);
      how = 0;
    }
    else {
      how = 0xe;
    }
    bVar16 = false;
    bVar15 = false;
  }
LAB_00190b4f:
  iVar12 = logfile;
  log_finish(LS_DONE);
  write_log_toptenentry(iVar12,how);
  program_state.something_worth_saving = 0;
  uVar5 = 0xffffffff;
  if (!bVar16) {
    uVar5 = (uint)(how != 0xe);
  }
  bVar1 = paybill(uVar5);
  paygd();
  clearpriests();
  (*windowprocs.win_pause)(P_MESSAGE);
  if (how < 0xc) {
    check_tutorial_message(0x167);
  }
  if (flags.end_disclose != '-') {
    local_1c4 = '\x01';
    if (flags.end_disclose == 'n') {
      cVar2 = 'n';
LAB_00190be7:
      bVar16 = false;
    }
    else {
      cVar2 = 'y';
      if (flags.end_disclose != '+') goto LAB_00190be7;
      bVar16 = true;
      local_1c4 = '\0';
    }
    if (invent != (obj *)0x0) {
      if (bVar1 == '\0') {
        builtin_strncpy(local_1b8 + 0x20,"ntified?",9);
        builtin_strncpy(local_1b8 + 0x10," possessions ide",0x10);
        builtin_strncpy(local_1b8,"Do you want your",0x10);
      }
      else {
        pcVar11 = "died";
        if (how == 0xe) {
          pcVar11 = "quit";
        }
        sprintf(local_1b8,"Do you want to see what you had when you %s?",pcVar11);
      }
      if (program_state.stopprint != 0) goto LAB_00190dca;
      cVar3 = cVar2;
      if (!bVar16) {
        cVar3 = yn_function(local_1b8,"ynq",cVar2);
      }
      if (cVar3 == 'q') {
        program_state.stopprint = program_state.stopprint + 1;
      }
      else if (cVar3 == 'y') {
        display_inventory((char *)0x0,'\x01');
        container_contents(invent,'\x01',show_empty);
      }
    }
    if (program_state.stopprint == 0) {
      cVar3 = cVar2;
      if (!bVar16) {
        cVar3 = yn_function("Do you want to see your attributes?","ynq",cVar2);
      }
      if (cVar3 == 'q') {
        program_state.stopprint = program_state.stopprint + 1;
      }
      else if (cVar3 == 'y') {
        enlightenment((how < 0xc) + 1);
      }
    }
    if (((program_state.stopprint == 0) &&
        (list_vanquished(cVar2,local_1c4), program_state.stopprint == 0)) &&
       (list_genocided(cVar2,local_1c4), program_state.stopprint == 0)) {
      if (!bVar16) {
        cVar2 = yn_function("Do you want to see your conduct?","ynq",cVar2);
      }
      if (cVar2 == 'q') {
        program_state.stopprint = program_state.stopprint + 1;
      }
      else if (cVar2 == 'y') {
        show_conduct((how < 0xc) + 1);
      }
    }
  }
LAB_00190dca:
  pcVar11 = begin_dump(how);
  dump_catch_menus('\x01');
  display_inventory((char *)0x0,'\x01');
  container_contents(invent,'\0',show_empty_00);
  dump_spells();
  dump_skills();
  iVar12 = (how < 0xc) + 1;
  enlightenment(iVar12);
  list_vanquished('y','\0');
  list_genocided('y','\0');
  show_conduct(iVar12);
  dooverview();
  dohistory();
  dump_catch_menus('\0');
  if ((bool)(bVar1 != '\0' & bVar15)) {
    finish_paybill();
  }
  bVar4 = deepest_lev_reached('\0');
  lVar6 = money_cnt(invent);
  lVar10 = (long)u.umoney0;
  lVar7 = hidden_gold();
  lVar7 = lVar7 + lVar6;
  uVar13 = 0;
  if (0 < lVar7 - lVar10) {
    uVar13 = lVar7 - lVar10;
  }
  if (how < 0xc) {
    uVar13 = uVar13 - uVar13 / 10;
  }
  iVar12 = u.urscore + (char)bVar4 * 0x32 + (int)uVar13 + -0x32;
  if ('\x14' < (char)bVar4) {
    iVar9 = 10000;
    if (bVar4 < 0x1f) {
      iVar9 = (char)bVar4 * 1000 + -20000;
    }
    iVar12 = iVar12 + iVar9;
  }
  u.urscore = iVar12 << ((how & 0xfffffffeU) == 0x10);
  if ((bVar15) &&
     ((flags.debug == '\0' ||
      ((program_state.stopprint == 0 && (cVar2 = yn_function("Save bones?","yn",'n'), cVar2 == 'y'))
      )))) {
    savebones(local_1d8);
  }
  done_money = (int)lVar7;
  end_dump(how,killbuf,pbuf,lVar7);
  display_rip(how,killbuf,pbuf,lVar7);
  pcVar14 = "";
  if (pcVar11 != (char *)0x0) {
    pcVar14 = pcVar11;
  }
  update_topten(how,pcVar14);
LAB_00190f9a:
  terminate();
}

Assistant:

void done(int how)
{
	int fd;
	boolean taken;
	char pbuf[BUFSZ];
	boolean bones_ok;
	struct obj *corpse = NULL;
	long umoney;
	const char *dumpname;

	if (check_survival(how, killbuf))
	    return;
	
	/* replays are done here: no dumping or high-score calculation required */
	if (program_state.viewing)
	    terminate();
	
	/*
	 *	The game is now over...
	 */
	program_state.gameover = 1;
	
	/* don't do the whole post-game dance if the game exploded */
	if (how == PANICKED)
	    terminate();
	
	log_command_result();
	/* render vision subsystem inoperative */
	iflags.vision_inited = 0;
	/* might have been killed while using a disposable item, so make sure
	   it's gone prior to inventory disclosure and creation of bones data */
	inven_inuse(TRUE);

	/* Sometimes you die on the first move.  Life's not fair.
	 * On those rare occasions you get hosed immediately, go out
	 * smiling... :-)  -3.
	 */
	if (moves <= 1 && how < PANICKED)	/* You die... --More-- */
	    pline("Do not pass go.  Do not collect 200 %s.", currency(200L));

	bones_ok = (how < GENOCIDED) && can_make_bones(&u.uz);

	if (how == TURNED_SLIME)
	    u.ugrave_arise = PM_GREEN_SLIME;

	if (bones_ok && u.ugrave_arise < LOW_PM) {
	    /* corpse gets burnt up too */
	    if (how == BURNING)
		u.ugrave_arise = (NON_PM - 2);	/* leave no corpse */
	    else if (how == STONING)
		u.ugrave_arise = (NON_PM - 1);	/* statue instead of corpse */
	    else if (u.ugrave_arise == NON_PM &&
		     !(mvitals[u.umonnum].mvflags & G_NOCORPSE)) {
		int mnum = u.umonnum;

		if (!Upolyd) {
		    /* Base corpse on race when not poly'd since original
		     * u.umonnum is based on role, and all role monsters
		     * are human.
		     */
		    mnum = (flags.female && urace.femalenum != NON_PM) ?
			urace.femalenum : urace.malenum;
		}
		corpse = mk_named_object(CORPSE, &mons[mnum],
				       u.ux, u.uy, plname);
		sprintf(pbuf, "%s, %s%s", plname,
			killer_format == NO_KILLER_PREFIX ? "" :
			killed_by_prefix[how],
			killer_format == KILLED_BY_AN ? an(killer) : killer);
		make_grave(level, u.ux, u.uy, pbuf);
	    }
	}

	if (how == QUIT) {
		killer_format = NO_KILLER_PREFIX;
		if (u.uhp < 1) {
			how = DIED;
			u.umortality++;	/* skipped above when how==QUIT */
			/* note that killer is pointing at killbuf */
			strcpy(killbuf, "quit while already on Charon's boat");
		}
	}
	if (how == ESCAPED || how == DEFIED)
		killer_format = NO_KILLER_PREFIX;
	
	fd = logfile;
	log_finish(LS_DONE);
	/* write_log_toptenentry needs killer_format */
	write_log_toptenentry(fd, how);
	/* in case of a subsequent panic(), there's no point trying to save */
	program_state.something_worth_saving = 0;

	/* these affect score and/or bones, but avoid them during panic */
	taken = paybill((how == ESCAPED) ? -1 : (how != QUIT));
	paygd();
	clearpriests();

	win_pause_output(P_MESSAGE);

	if (how < PANICKED)
	    check_tutorial_message(QT_T_DEATH);

	if (flags.end_disclose != DISCLOSE_NO_WITHOUT_PROMPT)
	    disclose(how, taken);

	dumpname = begin_dump(how);
	dump_disclose(how);
	
	/* finish_paybill should be called after disclosure but before bones */
	if (bones_ok && taken) finish_paybill();

	/* calculate score, before creating bones [container gold] */
	umoney = calc_score(how);

	if (bones_ok) {
	    if (!wizard || (!done_stopprint && yn("Save bones?") == 'y'))
		savebones(corpse);
	    /* corpse may be invalid pointer now so
		ensure that it isn't used again */
	    corpse = NULL;
	}

	/* update gold for the rip output, which can't use hidden_gold()
	   (containers will be gone by then if bones just got saved...) */
	done_money = umoney;

	end_dump(how, killbuf, pbuf, umoney);
	display_rip(how, killbuf, pbuf, umoney);

	/* generate a topten entry for this game.
	   update_topten does not display anything. */
	update_topten(how, dumpname ? dumpname : "");

	terminate();
}